

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weibull_dist.hpp
# Opt level: O2

result_type_conflict1 __thiscall
trng::weibull_dist<float>::operator()(weibull_dist<float> *this,lcg64_shift *r)

{
  float fVar1;
  float fVar2;
  
  fVar1 = (this->P).theta_;
  fVar2 = utility::u01xx_traits<float,_1UL,_trng::lcg64_shift>::oc(r);
  fVar2 = logf(fVar2);
  fVar2 = powf(-fVar2,1.0 / (this->P).beta_);
  return fVar2 * fVar1;
}

Assistant:

TRNG_CUDA_ENABLE result_type operator()(R &r) {
      return P.theta() * math::pow(-math::ln(utility::uniformoc<result_type>(r)), 1 / P.beta());
    }